

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_ubo_reference.cpp
# Opt level: O0

ir_expression * __thiscall
anon_unknown.dwarf_623c5::lower_ubo_reference_visitor::calculate_ssbo_unsized_array_length
          (lower_ubo_reference_visitor *this,ir_expression *expr)

{
  bool bVar1;
  ir_dereference *deref_00;
  ir_variable *this_00;
  ir_variable *var;
  ir_dereference *deref;
  ir_rvalue *rvalue;
  ir_expression *expr_local;
  lower_ubo_reference_visitor *this_local;
  
  if (expr->operation == ir_unop_ssbo_unsized_array_length) {
    rvalue = &expr->super_ir_rvalue;
    expr_local = (ir_expression *)this;
    deref = (ir_dereference *)ir_instruction::as_rvalue(&expr->operands[0]->super_ir_instruction);
    if ((((ir_rvalue *)deref == (ir_rvalue *)0x0) ||
        (bVar1 = glsl_type::is_array(((ir_rvalue *)deref)->type), !bVar1)) ||
       (bVar1 = glsl_type::is_unsized_array((deref->super_ir_rvalue).type), !bVar1)) {
      this_local = (lower_ubo_reference_visitor *)0x0;
    }
    else {
      deref_00 = ir_instruction::as_dereference
                           ((ir_instruction *)rvalue[1].super_ir_instruction.super_exec_node.next);
      if (deref_00 == (ir_dereference *)0x0) {
        this_local = (lower_ubo_reference_visitor *)0x0;
      }
      else {
        this_00 = (ir_variable *)
                  (*(code *)(rvalue[1].super_ir_instruction.super_exec_node.next)->next[4].next)();
        if ((this_00 == (ir_variable *)0x0) ||
           (bVar1 = ir_variable::is_in_shader_storage_block(this_00), !bVar1)) {
          this_local = (lower_ubo_reference_visitor *)0x0;
        }
        else {
          this_local = (lower_ubo_reference_visitor *)
                       process_ssbo_unsized_array_length(this,(ir_rvalue **)&deref,deref_00,this_00)
          ;
        }
      }
    }
  }
  else {
    this_local = (lower_ubo_reference_visitor *)0x0;
  }
  return (ir_expression *)this_local;
}

Assistant:

ir_expression *
lower_ubo_reference_visitor::calculate_ssbo_unsized_array_length(ir_expression *expr)
{
   if (expr->operation !=
       ir_expression_operation(ir_unop_ssbo_unsized_array_length))
      return NULL;

   ir_rvalue *rvalue = expr->operands[0]->as_rvalue();
   if (!rvalue ||
       !rvalue->type->is_array() || !rvalue->type->is_unsized_array())
      return NULL;

   ir_dereference *deref = expr->operands[0]->as_dereference();
   if (!deref)
      return NULL;

   ir_variable *var = expr->operands[0]->variable_referenced();
   if (!var || !var->is_in_shader_storage_block())
      return NULL;
   return process_ssbo_unsized_array_length(&rvalue, deref, var);
}